

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5IterClose(Fts5IndexIter *pIndexIter)

{
  Fts5Index *p;
  Fts5Index *pIndex;
  Fts5Iter *pIter;
  Fts5IndexIter *pIndexIter_local;
  
  if (pIndexIter != (Fts5IndexIter *)0x0) {
    p = (Fts5Index *)pIndexIter[1].iRowid;
    fts5MultiIterFree((Fts5Iter *)pIndexIter);
    fts5CloseReader(p);
  }
  return;
}

Assistant:

static void sqlite3Fts5IterClose(Fts5IndexIter *pIndexIter){
  if( pIndexIter ){
    Fts5Iter *pIter = (Fts5Iter*)pIndexIter;
    Fts5Index *pIndex = pIter->pIndex;
    fts5MultiIterFree(pIter);
    fts5CloseReader(pIndex);
  }
}